

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall cfd::core::DescriptorNode::CheckChecksum(DescriptorNode *this,string *descriptor)

{
  bool bVar1;
  long lVar2;
  CfdException *pCVar3;
  ulong uVar4;
  allocator local_109;
  string local_108;
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8;
  CfdSourceLocation local_a8;
  undefined1 local_90 [8];
  string checksum;
  allocator local_59;
  string local_58;
  unsigned_long local_38;
  CfdSourceLocation local_30;
  string *local_18;
  string *descriptor_local;
  DescriptorNode *this_local;
  
  local_18 = descriptor;
  descriptor_local = &this->name_;
  lVar2 = ::std::__cxx11::string::size();
  if (lVar2 != 8) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x3f8;
    local_30.funcname = "CheckChecksum";
    local_38 = ::std::__cxx11::string::size();
    logger::warn<unsigned_long>
              (&local_30,"Expected 8 character checksum, not {} characters.",&local_38);
    checksum.field_2._M_local_buf[0xb] = '\x01';
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"Expected 8 character checksum.",&local_59);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_58);
    checksum.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  GenerateChecksum((string *)local_90,local_18);
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = ::std::operator!=(&this->checksum_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90);
    if (!bVar1) {
      ::std::__cxx11::string::~string((string *)local_90);
      return;
    }
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x405;
    local_e8.funcname = "CheckChecksum";
    logger::warn<std::__cxx11::string&,std::__cxx11::string&>
              (&local_e8,"Provided checksum \'{}\' does not match computed checksum \'{}\'.",
               &this->checksum_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_108,"Unmatch checksum.",&local_109);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_108);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  local_a8.filename = local_a8.filename + 1;
  local_a8.line = 0x3ff;
  local_a8.funcname = "CheckChecksum";
  logger::warn<>(&local_a8,"Invalid characters in payload.");
  local_ca = 1;
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_c8,"Invalid characters in payload.",&local_c9);
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_c8);
  local_ca = 0;
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void DescriptorNode::CheckChecksum(const std::string& descriptor) {
  if (checksum_.size() != 8) {
    warn(
        CFD_LOG_SOURCE, "Expected 8 character checksum, not {} characters.",
        checksum_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Expected 8 character checksum.");
  }
  std::string checksum = GenerateChecksum(descriptor);
  if (checksum.empty()) {
    warn(CFD_LOG_SOURCE, "Invalid characters in payload.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid characters in payload.");
  }
  if (checksum_ != checksum) {
    warn(
        CFD_LOG_SOURCE,
        "Provided checksum '{}' does not match computed checksum '{}'.",
        checksum_, checksum);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch checksum.");
  }
}